

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DeleteTriggerStep(sqlite3 *db,TriggerStep *pTriggerStep)

{
  TriggerStep *pTVar1;
  TriggerStep *pTmp;
  
  if (pTriggerStep != (TriggerStep *)0x0) {
    do {
      pTVar1 = pTriggerStep->pNext;
      sqlite3ExprDelete(db,pTriggerStep->pWhere);
      sqlite3ExprListDelete(db,pTriggerStep->pExprList);
      clearSelect(db,pTriggerStep->pSelect,1);
      sqlite3IdListDelete(db,pTriggerStep->pIdList);
      sqlite3DbFree(db,pTriggerStep);
      pTriggerStep = pTVar1;
    } while (pTVar1 != (TriggerStep *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteTriggerStep(sqlite3 *db, TriggerStep *pTriggerStep){
  while( pTriggerStep ){
    TriggerStep * pTmp = pTriggerStep;
    pTriggerStep = pTriggerStep->pNext;

    sqlite3ExprDelete(db, pTmp->pWhere);
    sqlite3ExprListDelete(db, pTmp->pExprList);
    sqlite3SelectDelete(db, pTmp->pSelect);
    sqlite3IdListDelete(db, pTmp->pIdList);

    sqlite3DbFree(db, pTmp);
  }
}